

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ida_ls.c
# Opt level: O0

int idaLsPerf(IDAMem IDA_mem,int perftask)

{
  void *pvVar1;
  long lVar2;
  long lVar3;
  int in_ESI;
  IDAMem in_RDI;
  double dVar4;
  double dVar5;
  int lcfl;
  int lcfn;
  long nnid;
  long nstd;
  sunrealtype rcfl;
  sunrealtype rcfn;
  IDALsMem idals_mem;
  int local_4;
  
  if (in_RDI->ida_lmem == (void *)0x0) {
    IDAProcessError(in_RDI,-2,0x668,"idaLsPerf",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/ida/ida_ls.c"
                    ,"Linear solver memory is NULL.");
    local_4 = -2;
  }
  else {
    pvVar1 = in_RDI->ida_lmem;
    if (in_ESI == 0) {
      *(long *)((long)pvVar1 + 0xc0) = in_RDI->ida_nst;
      *(long *)((long)pvVar1 + 200) = in_RDI->ida_nni;
      *(long *)((long)pvVar1 + 0xd0) = in_RDI->ida_ncfn;
      *(undefined8 *)((long)pvVar1 + 0xd8) = *(undefined8 *)((long)pvVar1 + 0xa0);
      *(undefined8 *)((long)pvVar1 + 0xe0) = 0;
      local_4 = 0;
    }
    else {
      lVar2 = in_RDI->ida_nst - *(long *)((long)pvVar1 + 0xc0);
      lVar3 = in_RDI->ida_nni - *(long *)((long)pvVar1 + 200);
      if ((lVar2 == 0) || (lVar3 == 0)) {
        local_4 = 0;
      }
      else {
        dVar4 = (double)(in_RDI->ida_ncfn - *(long *)((long)pvVar1 + 0xd0)) / (double)lVar2;
        dVar5 = (double)(*(long *)((long)pvVar1 + 0xa0) - *(long *)((long)pvVar1 + 0xd8)) /
                (double)lVar3;
        if ((0.9 < dVar4) || (0.9 < dVar5)) {
          *(long *)((long)pvVar1 + 0xe0) = *(long *)((long)pvVar1 + 0xe0) + 1;
          if (*(long *)((long)pvVar1 + 0xe0) < 0xb) {
            if (0.9 < dVar4) {
              IDAProcessError((IDAMem)in_RDI->ida_tn,(int)dVar4,(int)in_RDI,(char *)0x63,
                              (char *)0x68f,"idaLsPerf",
                              "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/ida/ida_ls.c"
                              ,
                              "Warning: at t = %.15g, poor iterative algorithm performance. Nonlinear convergence failure rate is %.15g."
                             );
            }
            if (0.9 < dVar5) {
              IDAProcessError((IDAMem)in_RDI->ida_tn,(int)dVar5,(int)in_RDI,(char *)0x63,
                              (char *)0x694,"idaLsPerf",
                              "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/ida/ida_ls.c"
                              ,
                              "Warning: at t = %.15g, poor iterative algorithm performance. Linear convergence failure rate is %.15g."
                             );
            }
            local_4 = 0;
          }
          else {
            local_4 = 1;
          }
        }
        else {
          local_4 = 0;
        }
      }
    }
  }
  return local_4;
}

Assistant:

int idaLsPerf(IDAMem IDA_mem, int perftask)
{
  IDALsMem idals_mem;
  sunrealtype rcfn, rcfl;
  long int nstd, nnid;
  sunbooleantype lcfn, lcfl;

  /* access IDALsMem structure */
  if (IDA_mem->ida_lmem == NULL)
  {
    IDAProcessError(IDA_mem, IDALS_LMEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_LS_LMEM_NULL);
    return (IDALS_LMEM_NULL);
  }
  idals_mem = (IDALsMem)IDA_mem->ida_lmem;

  /* when perftask == 0, store current performance statistics */
  if (perftask == 0)
  {
    idals_mem->nst0  = IDA_mem->ida_nst;
    idals_mem->nni0  = IDA_mem->ida_nni;
    idals_mem->ncfn0 = IDA_mem->ida_ncfn;
    idals_mem->ncfl0 = idals_mem->ncfl;
    idals_mem->nwarn = 0;
    return (0);
  }

  /* Compute statistics since last call

     Note: the performance monitor that checked whether the average
       number of linear iterations was too close to maxl has been
       removed, since the 'maxl' value is no longer owned by the
       IDALs interface.
   */
  nstd = IDA_mem->ida_nst - idals_mem->nst0;
  nnid = IDA_mem->ida_nni - idals_mem->nni0;
  if (nstd == 0 || nnid == 0) { return (0); }

  rcfn = ((sunrealtype)(IDA_mem->ida_ncfn - idals_mem->ncfn0)) /
         ((sunrealtype)nstd);
  rcfl = ((sunrealtype)(idals_mem->ncfl - idals_mem->ncfl0)) /
         ((sunrealtype)nnid);
  lcfn = (rcfn > PT9);
  lcfl = (rcfl > PT9);
  if (!(lcfn || lcfl)) { return (0); }
  idals_mem->nwarn++;
  if (idals_mem->nwarn > 10) { return (1); }
  if (lcfn)
  {
    IDAProcessError(IDA_mem, IDA_WARNING, __LINE__, __func__, __FILE__,
                    MSG_LS_CFN_WARN, IDA_mem->ida_tn, rcfn);
  }
  if (lcfl)
  {
    IDAProcessError(IDA_mem, IDA_WARNING, __LINE__, __func__, __FILE__,
                    MSG_LS_CFL_WARN, IDA_mem->ida_tn, rcfl);
  }
  return (0);
}